

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O0

wchar_t borg_calc_formula(int *arg_formula)

{
  int local_444;
  bool local_43a;
  bool local_439;
  int **local_430;
  int *stackptr;
  wchar_t stack [256];
  wchar_t oper2;
  wchar_t oper1;
  int *arg_formula_local;
  
  if (arg_formula == (int *)0x0) {
    arg_formula_local._4_4_ = L'\0';
  }
  else {
    local_430 = &stackptr;
    for (_oper2 = arg_formula; *_oper2 != 0; _oper2 = _oper2 + 1) {
      switch(*_oper2) {
      case 1:
        *(int *)local_430 = _oper2[1];
        local_430 = (int **)((long)local_430 + 4);
        _oper2 = _oper2 + 1;
        break;
      case 2:
        *(int *)local_430 = borg_has[_oper2[1]];
        local_430 = (int **)((long)local_430 + 4);
        _oper2 = _oper2 + 1;
        break;
      case 3:
        *(uint *)(local_430 + -1) =
             (uint)(*(int *)(local_430 + -1) == *(int *)((long)local_430 + -4));
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 4:
        *(uint *)(local_430 + -1) =
             (uint)(*(int *)(local_430 + -1) != *(int *)((long)local_430 + -4));
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 5:
        *(uint *)((long)local_430 + -4) = (uint)((*(int *)((long)local_430 + -4) != 0 ^ 0xffU) & 1);
        break;
      case 6:
        *(uint *)(local_430 + -1) =
             (uint)(*(int *)(local_430 + -1) < *(int *)((long)local_430 + -4));
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 7:
        *(uint *)(local_430 + -1) =
             (uint)(*(int *)(local_430 + -1) <= *(int *)((long)local_430 + -4));
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 8:
        *(uint *)(local_430 + -1) =
             (uint)(*(int *)((long)local_430 + -4) < *(int *)(local_430 + -1));
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 9:
        *(uint *)(local_430 + -1) =
             (uint)(*(int *)((long)local_430 + -4) <= *(int *)(local_430 + -1));
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 10:
        local_439 = *(int *)(local_430 + -1) != 0 && *(int *)((long)local_430 + -4) != 0;
        *(uint *)(local_430 + -1) = (uint)local_439;
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 0xb:
        local_43a = *(int *)(local_430 + -1) != 0 || *(int *)((long)local_430 + -4) != 0;
        *(uint *)(local_430 + -1) = (uint)local_43a;
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 0xc:
        *(int *)(local_430 + -1) = *(int *)(local_430 + -1) + *(int *)((long)local_430 + -4);
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 0xd:
        *(int *)(local_430 + -1) = *(int *)(local_430 + -1) - *(int *)((long)local_430 + -4);
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 0xe:
        local_444 = *(int *)((long)local_430 + -4);
        if (local_444 == 0) {
          local_444 = 1;
        }
        *(int *)(local_430 + -1) = *(int *)(local_430 + -1) / local_444;
        local_430 = (int **)((long)local_430 + -4);
        break;
      case 0xf:
        *(int *)(local_430 + -1) = *(int *)(local_430 + -1) * *(int *)((long)local_430 + -4);
        local_430 = (int **)((long)local_430 + -4);
      }
    }
    arg_formula_local._4_4_ = *(wchar_t *)((long)local_430 + -4);
  }
  return arg_formula_local._4_4_;
}

Assistant:

int borg_calc_formula(int* arg_formula)
{
    int  oper1; /* operand #1 */
    int  oper2; /* operand #2 */
    int  stack[256]; /* stack */
    int* stackptr; /* stack pointer */

    if (!arg_formula)
        return 0;

    *stack = 0;
    /* loop until we hit BFO_DONE */
    for (stackptr = stack; *arg_formula; arg_formula++) {
        switch (*arg_formula) {
            /* Number */
        case BFO_NUMBER:
            *stackptr++ = *++arg_formula;
            break;

        /* Variable */
        case BFO_VARIABLE:
            *stackptr++ = borg_has[*++arg_formula];
            break;

        /* Equal */
        case BFO_EQ:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 == oper2);
            break;

        /* Not Equal */
        case BFO_NEQ:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 != oper2);
            break;

        /* Less Than */
        case BFO_LT:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 < oper2);
            break;

        /* Less Than Or Equal */
        case BFO_LTE:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 <= oper2);
            break;

        /* Greater Than */
        case BFO_GT:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 > oper2);
            break;

        /* Greater Than Or Equal */
        case BFO_GTE:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 >= oper2);
            break;

        /* Logical And */
        case BFO_AND:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 && oper2);
            break;

        /* Logical Or */
        case BFO_OR:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 || oper2);
            break;

        /* Plus */
        case BFO_PLUS:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 + oper2);
            break;

        /* Minus */
        case BFO_MINUS:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 - oper2);
            break;

        /* Divide */
        case BFO_DIVIDE:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 / (oper2 ? oper2 : 1));
            break;

        /* Multiply */
        case BFO_MULT:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 * oper2);
            break;

        /* Logical Not */
        case BFO_NOT:
            oper1       = *--stackptr;
            *stackptr++ = (!oper1);
            break;
        }
    }

    /* BFO_DONE */
    return *--stackptr;
}